

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interfaceOperations.cpp
# Opt level: O2

string * gmlc::networking::getLocalExternalAddressV4(string *__return_storage_ptr__,string *server)

{
  undefined8 *puVar1;
  long lVar2;
  pointer pbVar3;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var4;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  first1;
  pointer pbVar5;
  undefined8 uVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__str;
  bool bVar10;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  candidate_addresses;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> ndef;
  basic_resolver_iterator<asio::ip::tcp> local_298;
  string sstring;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  resolved_addresses;
  error_code ec;
  shared_ptr<gmlc::networking::AsioContextManager> srv;
  iterator end;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_1f0;
  _Head_base<0UL,_asio::io_context_*,_false> local_1e8;
  pointer local_1d8;
  undefined1 auStack_1d0 [40];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1a8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  interface_addresses;
  query query;
  query query_server;
  resolver resolver;
  
  query_server.hints_._0_8_ = &query_server.hints_.ai_addrlen;
  query_server.hints_.ai_socktype = 0;
  query_server.hints_.ai_protocol = 0;
  query_server.hints_.ai_addrlen._0_1_ = 0;
  AsioContextManager::getContextPointer((AsioContextManager *)&srv,(string *)&query_server);
  std::__cxx11::string::~string((string *)&query_server);
  asio::ip::basic_resolver<asio::ip::tcp,_asio::any_io_executor>::basic_resolver<asio::io_context>
            (&resolver,
             ((srv.
               super___shared_ptr<gmlc::networking::AsioContextManager,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->ictx)._M_t.
             super___uniq_ptr_impl<asio::io_context,_std::default_delete<asio::io_context>_>._M_t.
             super__Tuple_impl<0UL,_asio::io_context_*,_std::default_delete<asio::io_context>_>.
             super__Head_base<0UL,_asio::io_context_*,_false>._M_head_impl,0);
  sstring._M_dataplus._M_p._0_4_ = 2;
  std::__cxx11::string::string<std::allocator<char>>((string *)&query,"",(allocator<char> *)&ndef);
  asio::ip::basic_resolver_query<asio::ip::tcp>::basic_resolver_query
            (&query_server,(protocol_type *)&sstring,server,(string *)&query,address_configured);
  std::__cxx11::string::~string((string *)&query);
  ec._M_value = 0;
  ec._M_cat = (error_category *)std::_V2::system_category();
  asio::ip::basic_resolver<asio::ip::tcp,_asio::any_io_executor>::resolve
            ((results_type *)&query,&resolver,&query_server,&ec);
  local_1e8._M_head_impl = (io_context *)query.hints_._16_8_;
  _Stack_1f0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)query.hints_._8_8_;
  uVar6 = query.hints_._0_8_;
  query.hints_.ai_socktype = 0;
  query.hints_.ai_protocol = 0;
  query.hints_.ai_addrlen = 0;
  query.hints_._20_4_ = 0;
  query.hints_.ai_flags = 0;
  query.hints_.ai_family = 0;
  CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&query.hints_.ai_socktype);
  if (ec._M_value == 0) {
    lVar2 = *(long *)uVar6;
    lVar9 = (long)local_1e8._M_head_impl * 0x60;
    query.hints_.ai_family = *(int *)(lVar2 + 4 + lVar9);
    puVar1 = (undefined8 *)(lVar2 + 8 + lVar9);
    query.hints_._8_8_ = *puVar1;
    query.hints_._16_8_ = puVar1[1];
    query.hints_.ai_addr._0_4_ = *(undefined4 *)(lVar2 + 0x18 + lVar9);
    end.values_.
    super___shared_ptr<std::vector<asio::ip::basic_resolver_entry<asio::ip::tcp>,_std::allocator<asio::ip::basic_resolver_entry<asio::ip::tcp>_>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)0x0;
    end.values_.
    super___shared_ptr<std::vector<asio::ip::basic_resolver_entry<asio::ip::tcp>,_std::allocator<asio::ip::basic_resolver_entry<asio::ip::tcp>_>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    end.index_ = 0;
    bVar10 = *(short *)(lVar2 + lVar9) != 2;
    if (bVar10) {
      query.hints_.ai_family = 0;
    }
    else {
      query.hints_.ai_socktype = 0;
      query.hints_.ai_protocol = 0;
      query.hints_.ai_addrlen = 0;
      query.hints_._20_4_ = 0;
      query.hints_.ai_addr._0_4_ = 0;
    }
    query.hints_.ai_flags = (uint)bVar10;
    asio::ip::address::to_string_abi_cxx11_(&sstring,(address *)&query);
    netif::getInterfaceAddressesV4_abi_cxx11_();
    resolved_addresses.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    resolved_addresses.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    resolved_addresses.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_298.values_.
    super___shared_ptr<std::vector<asio::ip::basic_resolver_entry<asio::ip::tcp>,_std::allocator<asio::ip::basic_resolver_entry<asio::ip::tcp>_>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)
              CONCAT44(local_298.values_.
                       super___shared_ptr<std::vector<asio::ip::basic_resolver_entry<asio::ip::tcp>,_std::allocator<asio::ip::basic_resolver_entry<asio::ip::tcp>_>_>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr._4_4_,2);
    asio::ip::host_name_abi_cxx11_();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&candidate_addresses,"",(allocator<char> *)&local_1d8);
    asio::ip::basic_resolver_query<asio::ip::tcp>::basic_resolver_query
              (&query,(protocol_type *)&local_298,&ndef,(string *)&candidate_addresses,
               address_configured);
    std::__cxx11::string::~string((string *)&candidate_addresses);
    std::__cxx11::string::~string((string *)&ndef);
    asio::ip::basic_resolver<asio::ip::tcp,_asio::any_io_executor>::resolve
              ((results_type *)&ndef,&resolver,&query,&ec);
    local_298.index_ = ndef.field_2._M_allocated_capacity;
    local_298.values_.
    super___shared_ptr<std::vector<asio::ip::basic_resolver_entry<asio::ip::tcp>,_std::allocator<asio::ip::basic_resolver_entry<asio::ip::tcp>_>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)ndef._M_string_length;
    ndef._M_string_length = 0;
    ndef.field_2._M_allocated_capacity = 0;
    local_298.values_.
    super___shared_ptr<std::vector<asio::ip::basic_resolver_entry<asio::ip::tcp>,_std::allocator<asio::ip::basic_resolver_entry<asio::ip::tcp>_>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)ndef._M_dataplus._M_p;
    ndef._M_dataplus._M_p = (pointer)0x0;
    CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&ndef._M_string_length);
    if (ec._M_value == 0) {
      while( true ) {
        bVar10 = asio::ip::operator!=(&local_298,&end);
        if (!bVar10) break;
        pbVar3 = ((local_298.values_.
                   super___shared_ptr<std::vector<asio::ip::basic_resolver_entry<asio::ip::tcp>,_std::allocator<asio::ip::basic_resolver_entry<asio::ip::tcp>_>_>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr)->
                 super__Vector_base<asio::ip::basic_resolver_entry<asio::ip::tcp>,_std::allocator<asio::ip::basic_resolver_entry<asio::ip::tcp>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        candidate_addresses.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start._4_4_ =
             *(undefined4 *)((long)&pbVar3[local_298.index_].endpoint_.impl_.data_ + 4);
        puVar1 = (undefined8 *)((long)&pbVar3[local_298.index_].endpoint_.impl_.data_ + 8);
        local_1d8 = (pointer)*puVar1;
        auStack_1d0._0_8_ = puVar1[1];
        bVar10 = *(short *)&pbVar3[local_298.index_].endpoint_.impl_.data_ != 2;
        if (bVar10) {
          candidate_addresses.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start._4_4_ = 0;
          candidate_addresses.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = local_1d8;
          candidate_addresses.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)auStack_1d0._0_8_;
        }
        else {
          candidate_addresses.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          candidate_addresses.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        }
        candidate_addresses.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start._0_4_ = (uint)bVar10;
        asio::ip::address::to_string_abi_cxx11_(&ndef,(address *)&candidate_addresses);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &resolved_addresses,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ndef);
        std::__cxx11::string::~string((string *)&ndef);
        asio::ip::basic_resolver_iterator<asio::ip::tcp>::increment(&local_298);
      }
      CLI::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_1a8,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&interface_addresses);
      CLI::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)(auStack_1d0 + 0x10),
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&resolved_addresses);
      prioritizeExternalAddresses
                (&candidate_addresses,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_1a8,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)(auStack_1d0 + 0x10));
      CLI::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(auStack_1d0 + 0x10));
      CLI::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_1a8);
      std::__cxx11::string::string
                ((string *)__return_storage_ptr__,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(candidate_addresses.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start._4_4_,
                          (uint)candidate_addresses.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start));
      first1._M_current._4_4_ = sstring._M_dataplus._M_p._4_4_;
      first1._M_current._0_4_ = sstring._M_dataplus._M_p._0_4_;
      _Var4._M_current = (__return_storage_ptr__->_M_dataplus)._M_p;
      iVar7 = matchcount<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                        (first1,(__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 )(first1._M_current + sstring._M_string_length),_Var4,
                         (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          )(_Var4._M_current + __return_storage_ptr__->_M_string_length));
      pbVar5 = candidate_addresses.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (__str = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(candidate_addresses.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start._4_4_,
                            (uint)candidate_addresses.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start); __str != pbVar5;
          __str = __str + 1) {
        std::__cxx11::string::string((string *)&ndef,__str);
        _Var4._M_current._4_4_ = sstring._M_dataplus._M_p._4_4_;
        _Var4._M_current._0_4_ = sstring._M_dataplus._M_p._0_4_;
        iVar8 = matchcount<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                          (_Var4,(__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  )(_Var4._M_current + sstring._M_string_length),
                           (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            )ndef._M_dataplus._M_p,
                           (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            )(ndef._M_dataplus._M_p + ndef._M_string_length));
        if (6 < iVar8 && iVar7 < iVar8) {
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          _M_assign((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    __return_storage_ptr__,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ndef);
          iVar7 = iVar8;
        }
        std::__cxx11::string::~string((string *)&ndef);
      }
      CLI::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&candidate_addresses);
    }
    else {
      getLocalExternalAddressV4_abi_cxx11_();
    }
    CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               &local_298.values_.
                super___shared_ptr<std::vector<asio::ip::basic_resolver_entry<asio::ip::tcp>,_std::allocator<asio::ip::basic_resolver_entry<asio::ip::tcp>_>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
    asio::ip::basic_resolver_query<asio::ip::tcp>::~basic_resolver_query(&query);
    CLI::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&resolved_addresses);
    CLI::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&interface_addresses);
    std::__cxx11::string::~string((string *)&sstring);
    CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               &end.values_.
                super___shared_ptr<std::vector<asio::ip::basic_resolver_entry<asio::ip::tcp>,_std::allocator<asio::ip::basic_resolver_entry<asio::ip::tcp>_>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
  }
  else {
    getLocalExternalAddressV4_abi_cxx11_();
  }
  CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_1f0);
  asio::ip::basic_resolver_query<asio::ip::tcp>::~basic_resolver_query(&query_server);
  asio::detail::io_object_impl<asio::detail::resolver_service<asio::ip::tcp>,_asio::any_io_executor>
  ::~io_object_impl(&resolver.impl_);
  CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &srv.
              super___shared_ptr<gmlc::networking::AsioContextManager,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return __return_storage_ptr__;
}

Assistant:

std::string getLocalExternalAddressV4(const std::string& server)
{
#ifndef GMLC_NETWORKING_DISABLE_ASIO
    auto srv = gmlc::networking::AsioContextManager::getContextPointer();

    asio::ip::tcp::resolver resolver(srv->getBaseContext());

    asio::ip::tcp::resolver::query query_server(
        asio::ip::tcp::v4(), server, "");
    std::error_code ec;
    asio::ip::tcp::resolver::iterator it_server =
        resolver.resolve(query_server, ec);
    if (ec) {
        return getLocalExternalAddressV4();
    }
    asio::ip::tcp::endpoint servep = *it_server;

    asio::ip::tcp::resolver::iterator end;

    auto sstring = (it_server == end) ? server : servep.address().to_string();
#else
    std::string sstring = server;
#endif

    auto interface_addresses = gmlc::netif::getInterfaceAddressesV4();

    std::vector<std::string> resolved_addresses;
#ifndef GMLC_NETWORKING_DISABLE_ASIO
    asio::ip::tcp::resolver::query query(
        asio::ip::tcp::v4(), asio::ip::host_name(), "");
    asio::ip::tcp::resolver::iterator it = resolver.resolve(query, ec);
    if (ec) {
        return getLocalExternalAddressV4();
    }
    // asio::ip::tcp::endpoint endpoint = *it;

    while (it != end) {
        asio::ip::tcp::endpoint ept = *it;
        resolved_addresses.push_back(ept.address().to_string());
        ++it;
    }
#endif
    auto candidate_addresses =
        prioritizeExternalAddresses(interface_addresses, resolved_addresses);

    int cnt = 0;
    std::string def = candidate_addresses[0];
    cnt = matchcount(sstring.begin(), sstring.end(), def.begin(), def.end());
    for (auto ndef : candidate_addresses) {
        auto mcnt = matchcount(
            sstring.begin(), sstring.end(), ndef.begin(), ndef.end());
        if ((mcnt > cnt) && (mcnt >= 7)) {
            def = ndef;
            cnt = mcnt;
        }
    }
    return def;
}